

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O3

Vec4 rr::resolveMultisamplePixel(MultisampleConstPixelBufferAccess *access,int x,int y)

{
  undefined1 auVar1 [16];
  int iVar2;
  Vector<float,_4> *res;
  undefined4 in_register_00000034;
  int y_00;
  undefined1 auVar3 [16];
  Vec4 VVar4;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  iVar2 = *(int *)(CONCAT44(in_register_00000034,x) + 8);
  if (iVar2 < 1) {
    auVar3 = ZEXT816(0);
  }
  else {
    y_00 = 0;
    auVar3 = ZEXT816(0);
    do {
      tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)&local_48,x,y_00,y);
      local_58 = auVar3._0_4_;
      fStack_54 = auVar3._4_4_;
      fStack_50 = auVar3._8_4_;
      fStack_4c = auVar3._12_4_;
      auVar3._0_4_ = local_58 + local_48;
      auVar3._4_4_ = fStack_54 + fStack_44;
      auVar3._8_4_ = fStack_50 + fStack_40;
      auVar3._12_4_ = fStack_4c + fStack_3c;
      y_00 = y_00 + 1;
      iVar2 = *(int *)(CONCAT44(in_register_00000034,x) + 8);
    } while (y_00 < iVar2);
  }
  VVar4.m_data[0] = (float)iVar2;
  auVar1._4_4_ = VVar4.m_data[0];
  auVar1._0_4_ = VVar4.m_data[0];
  auVar1._8_4_ = VVar4.m_data[0];
  auVar1._12_4_ = VVar4.m_data[0];
  auVar3 = divps(auVar3,auVar1);
  (access->m_access).m_format.order = (int)auVar3._0_8_;
  (access->m_access).m_format.type = (int)((ulong)auVar3._0_8_ >> 0x20);
  (access->m_access).m_size.m_data[0] = auVar3._8_4_;
  (access->m_access).m_size.m_data[1] = auVar3._12_4_;
  VVar4.m_data[1] = VVar4.m_data[0];
  VVar4.m_data._8_8_ = auVar3._0_8_;
  return (Vec4)VVar4.m_data;
}

Assistant:

tcu::Vec4 resolveMultisamplePixel (const MultisampleConstPixelBufferAccess& access, int x, int y)
{
	tcu::Vec4 sum;
	for (int s = 0; s < access.getNumSamples(); s++)
		sum += access.raw().getPixel(s, x, y);

	return sum / (float)access.getNumSamples();
}